

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_queue.h
# Opt level: O0

optional<int> __thiscall
density::
function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
::try_consume_impl(function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                   *this,ControlBlock *param_2)

{
  bool bVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_int_()> *this_00;
  void *i_dest;
  int local_3c;
  int *local_38;
  int *result;
  consume_operation cons;
  function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  *this_local;
  
  cons.m_control = param_2;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
  ::try_start_consume((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
                       *)&result);
  bVar1 = density::heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)&result);
  if (bVar1) {
    this_00 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
              ::consume_operation::complete_type((consume_operation *)&result);
    i_dest = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
             ::consume_operation::unaligned_element_ptr((consume_operation *)&result);
    local_3c = detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>::
               align_invoke_destroy(this_00,i_dest);
    local_38 = &local_3c;
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
    ::consume_operation::commit_nodestroy((consume_operation *)&result);
    builtin_optional<int>::builtin_optional<int>((builtin_optional<int> *)this,local_38);
  }
  else {
    memset(this,0,8);
    builtin_optional<int>::builtin_optional((builtin_optional<int> *)this);
  }
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation((consume_operation *)&result);
  return (optional<int>)this;
}

Assistant:

optional<RET_VAL> try_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }